

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

lyxml_ns * lyxml_get_ns(lyxml_elem *elem,char *prefix)

{
  int iVar1;
  lyxml_attr *plVar2;
  
  do {
    if (elem == (lyxml_elem *)0x0) {
      return (lyxml_ns *)0x0;
    }
    for (plVar2 = elem->attr; plVar2 != (lyxml_attr *)0x0; plVar2 = plVar2->next) {
      if (plVar2->type == LYXML_ATTR_NS) {
        if (plVar2->name == (char *)0x0) {
          if (prefix == (char *)0x0) {
            if (plVar2->value != (char *)0x0) {
              return (lyxml_ns *)plVar2;
            }
            return (lyxml_ns *)0x0;
          }
        }
        else if ((prefix != (char *)0x0) && (iVar1 = strcmp(plVar2->name,prefix), iVar1 == 0)) {
          return (lyxml_ns *)plVar2;
        }
      }
    }
    elem = elem->parent;
  } while( true );
}

Assistant:

lyxml_ns *
lyxml_get_ns(const struct lyxml_elem *elem, const char *prefix)
{
    struct lyxml_attr *attr;

    if (!elem) {
        return NULL;
    }

    for (attr = elem->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_NS) {
            continue;
        }
        if (!attr->name) {
            if (!prefix) {
                /* default namespace found */
                if (!attr->value) {
                    /* empty default namespace -> no default namespace */
                    return NULL;
                }
                return (struct lyxml_ns *)attr;
            }
        } else if (prefix && !strcmp(attr->name, prefix)) {
            /* prefix found */
            return (struct lyxml_ns *)attr;
        }
    }

    /* go recursively */
    return lyxml_get_ns(elem->parent, prefix);
}